

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
bssl::der::Parser::ReadOptionalTag(Parser *this,CBS_ASN1_TAG tag,optional<bssl::der::Input> *out)

{
  bool bVar1;
  int iVar2;
  CBS_ASN1_TAG actual_tag;
  Input value;
  CBS_ASN1_TAG local_3c;
  Input local_38;
  
  if ((this->cbs_).len == 0) {
    bVar1 = true;
  }
  else {
    local_38.data_.data_ = (uchar *)0x0;
    local_38.data_.size_ = 0;
    bVar1 = PeekTagAndValue(this,&local_3c,&local_38);
    if (!bVar1) {
      return bVar1;
    }
    if (local_3c == tag) {
      if (this->advance_len_ != 0) {
        iVar2 = CBS_skip(&this->cbs_,this->advance_len_);
        this->advance_len_ = 0;
        if (iVar2 != 0) {
          (out->super__Optional_base<bssl::der::Input,_true,_true>)._M_payload.
          super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.data_ =
               local_38.data_.data_;
          (out->super__Optional_base<bssl::der::Input,_true,_true>)._M_payload.
          super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.size_ =
               local_38.data_.size_;
          if ((out->super__Optional_base<bssl::der::Input,_true,_true>)._M_payload.
              super__Optional_payload_base<bssl::der::Input>._M_engaged != false) {
            return bVar1;
          }
          (out->super__Optional_base<bssl::der::Input,_true,_true>)._M_payload.
          super__Optional_payload_base<bssl::der::Input>._M_engaged = true;
          return bVar1;
        }
      }
      abort();
    }
    this->advance_len_ = 0;
  }
  if ((out->super__Optional_base<bssl::der::Input,_true,_true>)._M_payload.
      super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
    (out->super__Optional_base<bssl::der::Input,_true,_true>)._M_payload.
    super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ReadOptionalTag(CBS_ASN1_TAG tag, std::optional<Input> *out) {
  if (!HasMore()) {
    *out = std::nullopt;
    return true;
  }
  CBS_ASN1_TAG actual_tag;
  Input value;
  if (!PeekTagAndValue(&actual_tag, &value)) {
    return false;
  }
  if (actual_tag == tag) {
    BSSL_CHECK(Advance());
    *out = value;
  } else {
    advance_len_ = 0;
    *out = std::nullopt;
  }
  return true;
}